

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_http_parse_get_body_len(http_context_t *ctx)

{
  http_string_t string;
  uint32_t local_28;
  uint32_t length;
  http_string_t length_str;
  http_context_t *ctx_local;
  
  string = get_request_header(ctx,"Content-Length");
  length_str.value = (char *)string.len;
  if (length_str.value == (char *)0x0) {
    ctx->body_len = 0;
  }
  else {
    local_28 = nh_string_to_uint(string);
    if (local_28 == 0) {
      local_28 = 0;
    }
    ctx->body_len = local_28;
  }
  return;
}

Assistant:

void nh_http_parse_get_body_len(http_context_t *ctx) {
    http_string_t length_str = get_request_header(ctx, "Content-Length");
    if (length_str.len == 0) {
        ctx->body_len = 0;
    } else {
        uint32_t length = nh_string_to_uint(length_str);
        ctx->body_len = length > 0 ? length : 0;
    }
}